

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,bool linking)

{
  cmTarget *pcVar1;
  cmake *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  cmListFileBacktrace *bt;
  PolicyID id;
  MessageType t;
  ostringstream e;
  undefined1 local_208 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_1e8;
  PositionType local_1e0;
  string local_1d8;
  Snapshot local_1b8;
  undefined1 local_1a0 [376];
  
  pcVar1 = dependee_name->Target;
  if (pcVar1 != (cmTarget *)0x0 || linking) {
    if (linking && pcVar1 != (cmTarget *)0x0) {
      if ((pcVar1->TargetTypeValue == EXECUTABLE) &&
         (bVar2 = cmTarget::IsExecutableWithExports(pcVar1), !bVar2)) {
        return;
      }
    }
    else if (pcVar1 == (cmTarget *)0x0) {
      return;
    }
    AddTargetDepend(this,depender_index,pcVar1,linking);
    return;
  }
  pcVar1 = (this->Targets).super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
           _M_impl.super__Vector_impl_data._M_start[depender_index];
  if (pcVar1->TargetTypeValue == GLOBAL_TARGET) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  PVar3 = cmPolicies::PolicyMap::Get(&pcVar1->PolicyMap,CMP0046);
  t = FATAL_ERROR;
  if (2 < PVar3 - NEW) {
    if (PVar3 != WARN) goto LAB_00420d87;
    cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_208,(cmPolicies *)0x2e,id);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(char *)local_208._0_8_,local_208._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    t = AUTHOR_WARNING;
  }
  this_00 = this->GlobalGenerator->CMakeInstance;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"The dependency target \"",0x17);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(dependee_name->super_string)._M_dataplus._M_p,
                      (dependee_name->super_string)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" of target \"",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(pcVar1->Name)._M_dataplus._M_p,(pcVar1->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" does not exist.",0x11);
  bt = cmTarget::GetUtilityBacktrace(pcVar1,&dependee_name->super_string);
  if (bt == (cmListFileBacktrace *)0x0) {
    std::__cxx11::stringbuf::str();
    cmState::Snapshot::Snapshot(&local_1b8,(cmState *)0x0,(PositionType)ZEXT816(0));
    local_1e0 = local_1b8.Position.Position;
    local_208._24_8_ = local_1b8.State;
    pcStack_1e8 = local_1b8.Position.Tree;
    local_208._0_8_ = (char *)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_208._16_8_ = 0;
    cmake::IssueMessage(this_00,t,&local_1d8,(cmListFileBacktrace *)local_208);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_00420d87;
  }
  else {
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_00,t,(string *)local_208,bt);
    local_1d8.field_2._M_allocated_capacity = local_208._16_8_;
    local_1d8._M_dataplus._M_p = (pointer)local_208._0_8_;
    if ((undefined1 *)local_208._0_8_ == local_208 + 0x10) goto LAB_00420d87;
  }
  operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
LAB_00420d87:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmLinkItem const& dependee_name,
  bool linking)
{
  // Get the depender.
  cmTarget const* depender = this->Targets[depender_index];

  // Check the target's makefile first.
  cmTarget const* dependee = dependee_name.Target;

  if(!dependee && !linking &&
    (depender->GetType() != cmTarget::GLOBAL_TARGET))
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch(depender->GetPolicyStatusCMP0046())
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0046) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if(issueMessage)
      {
      cmake* cm = this->GlobalGenerator->GetCMakeInstance();

      e << "The dependency target \"" <<  dependee_name
        << "\" of target \"" << depender->GetName() << "\" does not exist.";

      cmListFileBacktrace const* backtrace =
        depender->GetUtilityBacktrace(dependee_name);
      if(backtrace)
        {
        cm->IssueMessage(messageType, e.str(), *backtrace);
        }
      else
        {
        cm->IssueMessage(messageType, e.str());
        }

      }
    }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if(linking && dependee &&
     dependee->GetType() == cmTarget::EXECUTABLE &&
     !dependee->IsExecutableWithExports())
    {
    dependee = 0;
    }

  if(dependee)
    {
    this->AddTargetDepend(depender_index, dependee, linking);
    }
}